

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic19::Run(UnitTest_semantic19 *this)

{
  Terminator *pTVar1;
  Terminator *j;
  Terminator *i;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string *in_stack_fffffffffffffe88;
  allocator *paVar2;
  FindName *in_stack_fffffffffffffe90;
  allocator *this_00;
  string *in_stack_fffffffffffffec8;
  UnitTestBase *in_stack_fffffffffffffed0;
  FindName *in_stack_fffffffffffffed8;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffee0;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [64];
  Terminator *local_a0;
  allocator local_91;
  string local_90 [64];
  Terminator *local_50;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"if i == 1 then local i = 1 elseif j == 1 then local j = 1 end",&local_31);
  anon_unknown.dwarf_fc1b::Semantic(in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"i",&local_91);
  FindName::FindName(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pTVar1 = ASTFind<luna::Terminator,FindName>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  FindName::~FindName((FindName *)0x1ab797);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  this_00 = &local_e1;
  local_50 = pTVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"j",this_00);
  FindName::FindName(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pTVar1 = ASTFind<luna::Terminator,FindName>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  FindName::~FindName((FindName *)0x1ab82b);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_a0 = pTVar1;
  if (local_50->scoping_ != LexicalScoping_Global) {
    paVar2 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"\'i->scoping_ == luna::LexicalScoping_Global\'",paVar2);
    UnitTestBase::Error(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  if (local_a0->scoping_ != LexicalScoping_Global) {
    paVar2 = (allocator *)&stack0xfffffffffffffecf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffed0,"\'j->scoping_ == luna::LexicalScoping_Global\'",
               paVar2);
    UnitTestBase::Error(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_00);
  return;
}

Assistant:

TEST_CASE(semantic19)
{
    auto ast = Semantic("if i == 1 then local i = 1 elseif j == 1 then local j = 1 end");
    auto i = ASTFind<luna::Terminator>(ast, FindName("i"));
    auto j = ASTFind<luna::Terminator>(ast, FindName("j"));
    EXPECT_TRUE(i->scoping_ == luna::LexicalScoping_Global);
    EXPECT_TRUE(j->scoping_ == luna::LexicalScoping_Global);
}